

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles2::Functional::UniformCase::compareUniformValues
          (UniformCase *this,
          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
          *values,vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                  *basicUniforms)

{
  long lVar1;
  long lVar2;
  ostringstream *this_00;
  ostringstream *this_01;
  DataType DVar3;
  TestLog *pTVar4;
  pointer pBVar5;
  pointer pVVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pBVar11;
  long lVar12;
  long lVar13;
  pointer pVVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  undefined1 local_1b0 [384];
  
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  bVar7 = true;
  lVar12 = 0x2c;
  lVar13 = 4;
  lVar15 = 0;
  do {
    pBVar5 = (basicUniforms->
             super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(basicUniforms->
                     super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5) / 0x98) <= lVar15)
    {
      return bVar7;
    }
    pVVar6 = (values->
             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// Checking uniform ");
    pBVar11 = pBVar5 + lVar15;
    std::operator<<((ostream *)this_00,(string *)pBVar11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    pVVar14 = pVVar6 + lVar15;
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if (pVVar14->type != TYPE_INVALID) {
      uVar8 = glu::getDataTypeScalarSize(pVVar14->type);
      DVar3 = pVVar14->type;
      if ((DVar3 - TYPE_FLOAT < 4) || (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9))
      {
        uVar9 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar9 = 0;
        }
        uVar10 = 0;
        do {
          if (uVar9 == uVar10) goto LAB_00ed0db8;
          fVar16 = *(float *)((long)&pVVar6->type + uVar10 * 4 + lVar13) -
                   *(float *)((long)&(pBVar5->name)._M_dataplus._M_p + uVar10 * 4 + lVar12);
          fVar17 = -fVar16;
          if (-fVar16 <= fVar16) {
            fVar17 = fVar16;
          }
          uVar10 = uVar10 + 1;
        } while (fVar17 < 0.05);
      }
      else if (DVar3 - TYPE_INT < 4) {
        uVar9 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar9 = 0;
        }
        uVar10 = 0;
        do {
          if (uVar9 == uVar10) goto LAB_00ed0db8;
          lVar1 = uVar10 * 4;
          lVar2 = uVar10 * 4;
          uVar10 = uVar10 + 1;
        } while (*(int *)((long)&pVVar6->type + lVar1 + lVar13) ==
                 *(int *)((long)&(pBVar5->name)._M_dataplus._M_p + lVar2 + lVar12));
      }
      else if (DVar3 - TYPE_BOOL < 4) {
        uVar9 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar9 = 0;
        }
        uVar10 = 0;
        do {
          if (uVar9 == uVar10) goto LAB_00ed0db8;
          lVar2 = uVar10 + lVar13;
          lVar1 = uVar10 + lVar12;
          uVar10 = uVar10 + 1;
        } while (*(char *)((long)&pVVar6->type + lVar2) ==
                 *(char *)((long)&(pBVar5->name)._M_dataplus._M_p + lVar1));
      }
      else if ((0x1d < DVar3 - TYPE_SAMPLER_1D) ||
              ((pVVar14->val).intV[0] == (pBVar11->finalValue).val.intV[0])) goto LAB_00ed0db8;
      this_01 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::operator<<((ostream *)this_01,
                      "// FAILURE: value obtained with glGetUniform*() for uniform ");
      std::operator<<((ostream *)this_01,(string *)pBVar11);
      std::operator<<((ostream *)this_01," differs from value set with glUniform*()");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      bVar7 = false;
    }
LAB_00ed0db8:
    lVar15 = lVar15 + 1;
    lVar12 = lVar12 + 0x98;
    lVar13 = lVar13 + 0x44;
  } while( true );
}

Assistant:

bool UniformCase::compareUniformValues (const vector<VarValue>& values, const vector<BasicUniform>& basicUniforms)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const VarValue&			unifValue	= values[unifNdx];

		log << TestLog::Message << "// Checking uniform " << uniform.name << TestLog::EndMessage;

		if (unifValue.type == glu::TYPE_INVALID) // This happens when glGetUniformLocation() returned -1.
			continue;

		if (!apiVarValueEquals(unifValue, uniform.finalValue))
		{
			log << TestLog::Message << "// FAILURE: value obtained with glGetUniform*() for uniform " << uniform.name << " differs from value set with glUniform*()" << TestLog::EndMessage;
			success = false;
		}
	}

	return success;
}